

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

void __thiscall
pstack::Dwarf::DIE::Raw::Raw(Raw *this,Unit *unit,DWARFReader *r,size_t abbrev,Off parent_)

{
  bool bVar1;
  Abbreviation *pAVar2;
  size_type __n;
  vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_> *this_00;
  reference __args_1;
  reference pvVar3;
  Off OVar4;
  FormEntry *form;
  const_iterator __end2;
  const_iterator __begin2;
  vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_> *__range2;
  size_type local_38;
  size_t i;
  Off parent__local;
  size_t abbrev_local;
  DWARFReader *r_local;
  Unit *unit_local;
  Raw *this_local;
  
  r_local = (DWARFReader *)unit;
  unit_local = (Unit *)this;
  pAVar2 = Unit::findAbbreviation(unit,abbrev);
  this->type = pAVar2;
  std::
  vector<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
  ::vector(&this->values);
  this->parent = parent_;
  this->firstChild = 0;
  this->nextSibling = 0;
  local_38 = 0;
  __n = std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>::size
                  (&this->type->forms);
  std::
  vector<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
  ::reserve(&this->values,__n);
  this_00 = &this->type->forms;
  __end2 = std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>::begin
                     (this_00);
  form = (FormEntry *)
         std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>::end
                   (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_pstack::Dwarf::FormEntry_*,_std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>_>
                      (&__end2,(__normal_iterator<const_pstack::Dwarf::FormEntry_*,_std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>_>
                                *)&form);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __args_1 = __gnu_cxx::
               __normal_iterator<const_pstack::Dwarf::FormEntry_*,_std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>_>
               ::operator*(&__end2);
    std::
    vector<pstack::Dwarf::DIE::Attribute::Value,std::allocator<pstack::Dwarf::DIE::Attribute::Value>>
    ::
    emplace_back<pstack::Dwarf::DWARFReader&,pstack::Dwarf::FormEntry_const&,pstack::Dwarf::Unit*&>
              ((vector<pstack::Dwarf::DIE::Attribute::Value,std::allocator<pstack::Dwarf::DIE::Attribute::Value>>
                *)&this->values,r,__args_1,(Unit **)&r_local);
    if ((int)local_38 == this->type->nextSibIdx) {
      pvVar3 = std::
               vector<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
               ::operator[](&this->values,local_38);
      this->nextSibling =
           (long)&pvVar3->block->offset +
           (long)r_local[5].io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
    }
    local_38 = local_38 + 1;
    __gnu_cxx::
    __normal_iterator<const_pstack::Dwarf::FormEntry_*,_std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>_>
    ::operator++(&__end2);
  }
  if ((this->type->hasChildren & 1U) == 0) {
    OVar4 = DWARFReader::getOffset(r);
    this->nextSibling = OVar4;
    this->firstChild = 0;
  }
  else {
    OVar4 = DWARFReader::getOffset(r);
    this->firstChild = OVar4;
  }
  return;
}

Assistant:

DIE::Raw::Raw(Unit *unit, DWARFReader &r, size_t abbrev, Elf::Off parent_)
    : type(unit->findAbbreviation(abbrev))
    , parent(parent_)
    , firstChild(0)
    , nextSibling(0)
{
    size_t i = 0;
    values.reserve(type->forms.size());
    for (auto &form : type->forms) {
        values.emplace_back(r, form, unit);
        if (int(i) == type->nextSibIdx)
            nextSibling = values[i].sdata + unit->offset;
        ++i;
    }
    if (type->hasChildren) {
        // If the type has children, last offset read is the first child.
        firstChild = r.getOffset();
    } else {
        nextSibling = r.getOffset(); // we have no children, so next DIE is next sib
        firstChild = 0; // no children.
    }
}